

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::FormalArgumentSymbol::FormalArgumentSymbol
          (FormalArgumentSymbol *this,string_view name,SourceLocation loc,
          ArgumentDirection direction,VariableLifetime lifetime)

{
  VariableSymbol::VariableSymbol(&this->super_VariableSymbol,FormalArgument,name,loc,lifetime);
  this->direction = direction;
  this->mergedVar = (VariableSymbol *)0x0;
  this->defaultValSyntax = (ExpressionSyntax *)0x0;
  this->defaultVal = (Expression *)0x0;
  return;
}

Assistant:

FormalArgumentSymbol::FormalArgumentSymbol(std::string_view name, SourceLocation loc,
                                           ArgumentDirection direction, VariableLifetime lifetime) :
    VariableSymbol(SymbolKind::FormalArgument, name, loc, lifetime), direction(direction) {
}